

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O3

QStringList * __thiscall
QAccessibleMenuItem::actionNames(QStringList *__return_storage_ptr__,QAccessibleMenuItem *this)

{
  char cVar1;
  long lVar2;
  QString *args;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (this->m_action != (QAction *)0x0) {
    cVar1 = QAction::isSeparator();
    if (cVar1 == '\0') {
      QAction::menuObject();
      lVar2 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
      if (lVar2 == 0) {
        args = (QString *)QAccessibleActionInterface::pressAction();
      }
      else {
        args = (QString *)QAccessibleActionInterface::showMenuAction();
      }
      QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,args);
      QList<QString>::end(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QAccessibleMenuItem::actionNames() const
{
    QStringList actions;
    if (!m_action || m_action->isSeparator())
        return actions;

    if (m_action->menu()) {
        actions << showMenuAction();
    } else {
        actions << pressAction();
    }
    return actions;
}